

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O3

bool Utilities::parseNumber<int>(string *s,int *x)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  bool bVar8;
  long local_1a0;
  stringstream ss;
  byte abStack_180 [96];
  ios_base local_120 [264];
  
  pcVar2 = (s->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  pcVar3 = pcVar2 + (cVar1 == '-');
  cVar7 = pcVar2[cVar1 == '-'];
  iVar4 = 0;
  if ((byte)(cVar7 - 0x30U) < 10) {
    iVar4 = 0;
    do {
      iVar4 = (int)((double)iVar4 * 10.0 + (double)(int)(char)(cVar7 + -0x30));
      cVar7 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while ((byte)(cVar7 - 0x30U) < 10);
  }
  if (cVar7 == '.') {
    cVar7 = pcVar3[1];
    pcVar3 = pcVar3 + 1;
    iVar5 = 0;
    if ((byte)(cVar7 - 0x30U) < 10) {
      iVar5 = 0;
      iVar6 = 1;
      do {
        iVar5 = (int)((double)iVar5 * 10.0 + (double)(int)(char)(cVar7 + -0x30));
        cVar7 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
        iVar6 = iVar6 + 1;
      } while ((byte)(cVar7 - 0x30U) < 10);
      do {
        iVar5 = (int)((double)iVar5 / 10.0);
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
    }
    iVar4 = iVar4 + iVar5;
  }
  iVar5 = -iVar4;
  if (cVar1 != '-') {
    iVar5 = iVar4;
  }
  *x = iVar5;
  if (*pcVar3 == '\0') {
    bVar8 = true;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0,(string *)s,_S_out|_S_in);
    std::istream::operator>>((istream *)&local_1a0,x);
    bVar8 = (abStack_180[*(long *)(local_1a0 + -0x18)] & 5) == 0;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return bVar8;
}

Assistant:

static bool parseNumber(const std::string& s, T &x)
    {
        const char* p = s.c_str();
        T r = 0.0;
        bool neg = false;
        if (*p == '-') {
            neg = true;
            ++p;
        }
        while (*p >= '0' && *p <= '9') {
            r = (r*10.0) + (*p - '0');
            ++p;
        }
        if (*p == '.') {
            T f = 0.0;
            int n = 0;
            ++p;
            while (*p >= '0' && *p <= '9') {
                f = (f*10.0) + (*p - '0');
                ++p;
                ++n;
            }

            while (n > 0)
            {
                f = f / 10.0;
                n--;
            }

            r += f;
        }
        if (neg) {
            r = -r;
        }

        x = r;

        if (*p == '\0')
            return true;

        // for some numbers in scientific notation 
        std::stringstream ss(s);
        ss >> x;
        return !ss.fail();
    }